

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<float>::Reserve(RepeatedField<float> *this,int new_size)

{
  int iVar1;
  Arena *this_00;
  undefined8 *puVar2;
  void **ppvVar3;
  void **ppvVar4;
  ulong uVar5;
  ulong n;
  
  iVar1 = this->total_size_;
  if (iVar1 < new_size) {
    ppvVar3 = (void **)((long)this->arena_or_elements_ + -8);
    ppvVar4 = (void **)0x0;
    if (0 < iVar1) {
      ppvVar4 = ppvVar3;
    }
    if (iVar1 == 0) {
      ppvVar3 = &this->arena_or_elements_;
    }
    this_00 = (Arena *)*ppvVar3;
    if (new_size < iVar1 * 2) {
      new_size = iVar1 * 2;
    }
    uVar5 = 4;
    if (4 < new_size) {
      uVar5 = (ulong)(uint)new_size;
    }
    if (this_00 == (Arena *)0x0) {
      puVar2 = (undefined8 *)operator_new(uVar5 * 4 + 8);
    }
    else {
      n = uVar5 * 4 + 0xf & 0x3fffffff8;
      if (this_00->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(this_00,(type_info *)&char::typeinfo,n);
      }
      puVar2 = (undefined8 *)internal::ArenaImpl::AllocateAligned((ArenaImpl *)this_00,n);
    }
    *puVar2 = this_00;
    this->total_size_ = (int)uVar5;
    this->arena_or_elements_ = puVar2 + 1;
    if (0 < (long)this->current_size_) {
      memcpy(puVar2 + 1,ppvVar4 + 1,(long)this->current_size_ << 2);
    }
    if ((0 < iVar1) && (*ppvVar4 == (void *)0x0)) {
      operator_delete(ppvVar4);
      return;
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;
  Rep* old_rep = total_size_ > 0 ? rep() : NULL;
  Rep* new_rep;
  Arena* arena = GetArenaNoVirtual();
  new_size = std::max(internal::kMinRepeatedFieldAllocationSize,
                      std::max(total_size_ * 2, new_size));
  GOOGLE_DCHECK_LE(
      static_cast<size_t>(new_size),
      (std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == NULL) {
    new_rep = static_cast<Rep*>(::operator new(bytes));
  } else {
    new_rep = reinterpret_cast<Rep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;
  int old_total_size = total_size_;
  total_size_ = new_size;
  arena_or_elements_ = new_rep->elements;
  // Invoke placement-new on newly allocated elements. We shouldn't have to do
  // this, since Element is supposed to be POD, but a previous version of this
  // code allocated storage with "new Element[size]" and some code uses
  // RepeatedField with non-POD types, relying on constructor invocation. If
  // Element has a trivial constructor (e.g., int32), gcc (tested with -O2)
  // completely removes this loop because the loop body is empty, so this has no
  // effect unless its side-effects are required for correctness.
  // Note that we do this before MoveArray() below because Element's copy
  // assignment implementation will want an initialized instance first.
  Element* e = &elements()[0];
  Element* limit = e + total_size_;
  for (; e < limit; e++) {
    new (e) Element;
  }
  if (current_size_ > 0) {
    MoveArray(&elements()[0], old_rep->elements, current_size_);
  }

  // Likewise, we need to invoke destructors on the old array.
  InternalDeallocate(old_rep, old_total_size);

}